

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecOrder.c
# Opt level: O3

Vec_Int_t *
Gia_PolynFindOrder(Gia_Man_t *pGia,Vec_Int_t *vFadds,Vec_Int_t *vHadds,int fVerbose,int fVeryVerbose
                  )

{
  uint uVar1;
  undefined8 uVar2;
  int *piVar3;
  int iVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  Vec_Int_t *p;
  int *piVar8;
  void *__s;
  Vec_Int_t *pVVar9;
  Vec_Int_t *vNodes;
  uint uVar10;
  long lVar11;
  int iVar12;
  uint uVar13;
  Gia_Obj_t *pGVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  uint local_44;
  
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  piVar8 = (int *)malloc(400);
  p->pArray = piVar8;
  uVar1 = pGia->nObjs;
  uVar13 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar13 = uVar1;
  }
  if (uVar13 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)(int)uVar13 << 2);
    if (__s == (void *)0x0) {
      __s = (void *)0x0;
    }
    else {
      memset(__s,0,(long)(int)uVar1 * 4);
    }
  }
  pVVar9 = pGia->vCos;
  if (0 < pVVar9->nSize) {
    piVar8 = pVVar9->pArray;
    lVar11 = 0;
    do {
      iVar12 = piVar8[lVar11];
      if (((long)iVar12 < 0) || (pGia->nObjs <= iVar12)) goto LAB_0067bdf1;
      uVar13 = iVar12 - (*(uint *)(pGia->pObjs + iVar12) & 0x1fffffff);
      if (((int)uVar13 < 0) || ((int)uVar1 <= (int)uVar13)) goto LAB_0067bdd2;
      *(undefined4 *)((long)__s + (ulong)uVar13 * 4) = 1;
      lVar11 = lVar11 + 1;
    } while (lVar11 < pVVar9->nSize);
  }
  pVVar9 = pGia->vXors;
  if (pVVar9 != (Vec_Int_t *)0x0) {
    if (pVVar9->pArray != (int *)0x0) {
      free(pVVar9->pArray);
      pGia->vXors->pArray = (int *)0x0;
      pVVar9 = pGia->vXors;
      if (pVVar9 == (Vec_Int_t *)0x0) goto LAB_0067b761;
    }
    free(pVVar9);
    pGia->vXors = (Vec_Int_t *)0x0;
  }
LAB_0067b761:
  pVVar9 = Gia_PolynCollectLastXor(pGia,fVerbose);
  pGia->vXors = pVVar9;
  printf("Collected %d topmost XORs\n",(ulong)(uint)pVVar9->nSize);
  pVVar9 = pGia->vXors;
  if (0 < pVVar9->nSize) {
    lVar11 = 0;
    do {
      uVar13 = pVVar9->pArray[lVar11];
      lVar17 = (long)(int)uVar13;
      if ((lVar17 < 0) || (pGia->nObjs <= (int)uVar13)) goto LAB_0067bdf1;
      if ((int)uVar1 <= (int)uVar13) {
LAB_0067bdb3:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (*(int *)((long)__s + lVar17 * 4) == 0) {
        __assert_fail("Vec_IntEntry(vMap, iAnd)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecOrder.c"
                      ,0x3e,
                      "Vec_Int_t *Gia_PolynFindOrder(Gia_Man_t *, Vec_Int_t *, Vec_Int_t *, int, int)"
                     );
      }
      pGVar14 = pGia->pObjs + lVar17;
      *(undefined4 *)((long)__s + lVar17 * 4) = 0;
      uVar7 = uVar13 - (*(uint *)pGVar14 & 0x1fffffff);
      if (((int)uVar7 < 0) || (uVar1 <= uVar7)) {
LAB_0067bdd2:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      *(undefined4 *)((long)__s + (ulong)uVar7 * 4) = 1;
      uVar7 = uVar13 - (*(uint *)&pGVar14->field_0x4 & 0x1fffffff);
      if (((int)uVar7 < 0) || (uVar1 <= uVar7)) goto LAB_0067bdd2;
      *(undefined4 *)((long)__s + (ulong)uVar7 * 4) = 1;
      Vec_IntPush(p,uVar13 * 4 + 3);
      if (fVeryVerbose != 0) {
        printf("Recognizing %d => XXXOR(%d %d)\n",(ulong)uVar13,
               (ulong)(uVar13 - ((uint)*(undefined8 *)pGVar14 & 0x1fffffff)),
               (ulong)(uVar13 - ((uint)((ulong)*(undefined8 *)pGVar14 >> 0x20) & 0x1fffffff)));
      }
      lVar11 = lVar11 + 1;
      pVVar9 = pGia->vXors;
    } while (lVar11 < pVVar9->nSize);
  }
  local_44 = 0;
  do {
    if (fVeryVerbose != 0) {
      printf("Iteration %d\n",(ulong)local_44);
    }
    bVar6 = false;
    do {
      uVar13 = vFadds->nSize;
      if ((int)uVar13 < 5) break;
      uVar15 = (ulong)uVar13 / 5;
      iVar12 = ((uint)((ulong)uVar13 * 0xcccccccd >> 0x20) & 0xfffffffc) - 2;
      uVar16 = uVar15 + 1;
      bVar5 = false;
      lVar11 = uVar15 * 5;
      do {
        lVar17 = lVar11 + -5;
        if (((long)vFadds->nSize <= lVar11 + -2) ||
           (iVar4 = (int)lVar11, (uint)vFadds->nSize <= iVar4 - 1U)) goto LAB_0067bdb3;
        piVar8 = vFadds->pArray;
        uVar13 = piVar8[lVar11 + -2];
        if (((int)uVar13 < 0) || ((int)uVar1 <= (int)uVar13)) goto LAB_0067bdb3;
        if (*(int *)((long)__s + (ulong)uVar13 * 4) != 0) {
          uVar7 = piVar8[lVar11 + -1];
          if (((int)uVar7 < 0) || (uVar1 <= uVar7)) goto LAB_0067bdb3;
          if (*(int *)((long)__s + (ulong)uVar7 * 4) != 0) {
            *(undefined4 *)((long)__s + (ulong)uVar13 * 4) = 0;
            *(undefined4 *)((long)__s + (ulong)uVar7 * 4) = 0;
            if (vFadds->nSize <= lVar17) goto LAB_0067bdb3;
            uVar10 = piVar8[lVar17];
            if (((long)(int)uVar10 < 0) || (uVar1 <= uVar10)) goto LAB_0067bdd2;
            *(undefined4 *)((long)__s + (long)(int)uVar10 * 4) = 1;
            if ((long)vFadds->nSize <= lVar11 + -4) goto LAB_0067bdb3;
            uVar10 = piVar8[lVar11 + -4];
            if (((long)(int)uVar10 < 0) || (uVar1 <= uVar10)) goto LAB_0067bdd2;
            *(undefined4 *)((long)__s + (long)(int)uVar10 * 4) = 1;
            if ((long)vFadds->nSize <= lVar11 + -3) goto LAB_0067bdb3;
            uVar10 = piVar8[lVar11 + -3];
            if (((long)(int)uVar10 < 0) || (uVar1 <= uVar10)) goto LAB_0067bdd2;
            *(undefined4 *)((long)__s + (long)(int)uVar10 * 4) = 1;
            Vec_IntPush(p,iVar12);
            if (fVeryVerbose != 0) {
              uVar10 = vFadds->nSize;
              if ((((int)uVar10 <= lVar17) || (uVar10 <= iVar4 - 4U)) || (uVar10 <= iVar4 - 3U))
              goto LAB_0067bdb3;
              piVar8 = vFadds->pArray;
              printf("Recognizing (%d %d) => FA(%d %d %d)\n",(ulong)uVar13,(ulong)uVar7,
                     (ulong)(uint)piVar8[lVar17],(ulong)(uint)piVar8[lVar11 + -4],
                     (ulong)(uint)piVar8[lVar11 + -3]);
            }
            bVar6 = true;
            bVar5 = true;
          }
        }
        uVar16 = uVar16 - 1;
        iVar12 = iVar12 + -4;
        lVar11 = lVar17;
      } while (1 < uVar16);
    } while (bVar5);
    uVar13 = vHadds->nSize;
    if (1 < (int)uVar13) {
      uVar15 = (ulong)(uVar13 >> 1) + 1;
      iVar12 = (uVar13 >> 1) * 4 + -3;
      uVar16 = (ulong)(uVar13 & 0xfffffffe);
      do {
        if (((long)vHadds->nSize <= (long)(uVar16 - 2)) || ((uint)vHadds->nSize <= (int)uVar16 - 1U)
           ) goto LAB_0067bdb3;
        uVar13 = vHadds->pArray[uVar15 * 2 + -4];
        if (((int)uVar13 < 0) || ((int)uVar1 <= (int)uVar13)) goto LAB_0067bdb3;
        if (*(int *)((long)__s + (ulong)uVar13 * 4) != 0) {
          uVar7 = vHadds->pArray[uVar15 * 2 + -3];
          uVar18 = (ulong)uVar7;
          if (((int)uVar7 < 0) || (uVar1 <= uVar7)) goto LAB_0067bdb3;
          if (*(int *)((long)__s + uVar18 * 4) != 0) {
            if (pGia->nObjs <= (int)uVar7) goto LAB_0067bdf1;
            pGVar14 = pGia->pObjs;
            *(undefined4 *)((long)__s + (ulong)uVar13 * 4) = 0;
            *(undefined4 *)((long)__s + uVar18 * 4) = 0;
            uVar10 = uVar7 - (*(uint *)(pGVar14 + uVar18) & 0x1fffffff);
            if (((int)uVar10 < 0) || (uVar1 <= uVar10)) goto LAB_0067bdd2;
            pGVar14 = pGVar14 + uVar18;
            *(undefined4 *)((long)__s + (ulong)uVar10 * 4) = 1;
            uVar10 = uVar7 - (*(uint *)&pGVar14->field_0x4 & 0x1fffffff);
            if (((int)uVar10 < 0) || (uVar1 <= uVar10)) goto LAB_0067bdd2;
            *(undefined4 *)((long)__s + (ulong)uVar10 * 4) = 1;
            Vec_IntPush(p,iVar12);
            bVar6 = true;
            if (fVeryVerbose != 0) {
              uVar2 = *(undefined8 *)pGVar14;
              printf("Recognizing (%d %d) => HA(%d %d)\n",(ulong)uVar13,(ulong)uVar7,
                     (ulong)(uVar7 - ((uint)uVar2 & 0x1fffffff)),
                     (ulong)(uVar7 - ((uint)((ulong)uVar2 >> 0x20) & 0x1fffffff)));
            }
          }
        }
        uVar15 = uVar15 - 1;
        iVar12 = iVar12 + -4;
        uVar16 = uVar16 - 2;
      } while (1 < uVar15);
    }
    local_44 = local_44 + 1;
  } while (bVar6);
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  pVVar9->nCap = 100;
  pVVar9->nSize = 0;
  piVar8 = (int *)malloc(400);
  pVVar9->pArray = piVar8;
  if ((int)uVar1 < 1) {
    if (__s != (void *)0x0) goto LAB_0067bcb4;
  }
  else {
    lVar11 = 0;
    do {
      if (*(int *)((long)__s + lVar11 * 4) != 0) {
        if (pGia->nObjs <= lVar11) {
LAB_0067bdf1:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if ((~*(uint *)(pGia->pObjs + lVar11) & 0x1fffffff) != 0 &&
            -1 < (int)*(uint *)(pGia->pObjs + lVar11)) {
          Vec_IntPush(pVVar9,(int)lVar11);
        }
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != (int)uVar1);
LAB_0067bcb4:
    free(__s);
  }
  vNodes = (Vec_Int_t *)malloc(0x10);
  vNodes->nCap = 100;
  vNodes->nSize = 0;
  piVar8 = (int *)malloc(400);
  vNodes->pArray = piVar8;
  Gia_ManIncrementTravId(pGia);
  piVar8 = pVVar9->pArray;
  Gia_ManCollectAnds(pGia,piVar8,pVVar9->nSize,vNodes,(Vec_Int_t *)0x0);
  if (0 < vNodes->nSize) {
    piVar3 = vNodes->pArray;
    lVar11 = 0;
    do {
      piVar3[lVar11] = piVar3[lVar11] << 2;
      lVar11 = lVar11 + 1;
    } while (lVar11 < vNodes->nSize);
  }
  if (piVar8 != (int *)0x0) {
    free(piVar8);
  }
  free(pVVar9);
  uVar1 = p->nSize;
  piVar8 = p->pArray;
  if (1 < (int)uVar1) {
    uVar15 = 0;
    uVar13 = uVar1;
    do {
      uVar13 = uVar13 - 1;
      iVar12 = piVar8[uVar15];
      piVar8[uVar15] = piVar8[(int)uVar13];
      piVar8[(int)uVar13] = iVar12;
      uVar15 = uVar15 + 1;
    } while (uVar1 >> 1 != uVar15);
  }
  if ((int)uVar1 < 1) {
    if (piVar8 == (int *)0x0) goto LAB_0067bd97;
  }
  else {
    uVar15 = 0;
    do {
      Vec_IntPush(vNodes,piVar8[uVar15]);
      uVar15 = uVar15 + 1;
    } while (uVar1 != uVar15);
  }
  free(piVar8);
LAB_0067bd97:
  free(p);
  return vNodes;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Vec_Int_t * Gia_PolynFindOrder( Gia_Man_t * pGia, Vec_Int_t * vFadds, Vec_Int_t * vHadds, int fVerbose, int fVeryVerbose )
{
    int fDumpLeftOver = 0;
    int i, iXor, iMaj, iAnd, Entry, Iter, fFound, fFoundAll = 1;
    Vec_Int_t * vRecord = Vec_IntAlloc( 100 ), * vLeft, * vRecord2;
    Vec_Int_t * vMap = Vec_IntStart( Gia_ManObjNum(pGia) );
    Gia_ManForEachCoDriverId( pGia, iAnd, i )
        Vec_IntWriteEntry( vMap, iAnd, 1 );

    // collect the last XOR
    Vec_IntFreeP( &pGia->vXors );
    pGia->vXors = Gia_PolynCollectLastXor( pGia, fVerbose );
    printf( "Collected %d topmost XORs\n", Vec_IntSize(pGia->vXors) );
    //Vec_IntPrint( p->vXors );
    Vec_IntForEachEntry( pGia->vXors, iAnd, i )
    {
        Gia_Obj_t * pAnd = Gia_ManObj( pGia, iAnd );
        assert( Vec_IntEntry(vMap, iAnd) );
        Vec_IntWriteEntry( vMap, iAnd, 0 );
        Vec_IntWriteEntry( vMap, Gia_ObjFaninId0(pAnd, iAnd), 1 );
        Vec_IntWriteEntry( vMap, Gia_ObjFaninId1(pAnd, iAnd), 1 );
        Vec_IntPush( vRecord, Abc_Var2Lit2(iAnd, 3) );
        if ( fVeryVerbose )
            printf( "Recognizing %d => XXXOR(%d %d)\n", iAnd, Gia_ObjFaninId0(pAnd, iAnd), Gia_ObjFaninId1(pAnd, iAnd) );
    }

    // detect FAs and HAs
    for ( Iter = 0; fFoundAll; Iter++ )
    {
        if ( fVeryVerbose )
            printf( "Iteration %d\n", Iter );

        // check if we can extract FADDs
        fFoundAll = 0;
        do {
            fFound = 0;
            for ( i = Vec_IntSize(vFadds)/5 - 1; i >= 0; i-- )
            {
                iXor = Vec_IntEntry(vFadds, 5*i+3);
                iMaj = Vec_IntEntry(vFadds, 5*i+4);
                if ( Vec_IntEntry(vMap, iXor) && Vec_IntEntry(vMap, iMaj) )
                {
                    Vec_IntWriteEntry( vMap, iXor, 0 );
                    Vec_IntWriteEntry( vMap, iMaj, 0 );
                    Vec_IntWriteEntry( vMap, Vec_IntEntry(vFadds, 5*i+0), 1 );
                    Vec_IntWriteEntry( vMap, Vec_IntEntry(vFadds, 5*i+1), 1 );
                    Vec_IntWriteEntry( vMap, Vec_IntEntry(vFadds, 5*i+2), 1 );
                    Vec_IntPush( vRecord, Abc_Var2Lit2(i, 2) );
                    fFound = 1;
                    fFoundAll = 1;
                    if ( fVeryVerbose )
                        printf( "Recognizing (%d %d) => FA(%d %d %d)\n", iXor, iMaj, Vec_IntEntry(vFadds, 5*i+0), Vec_IntEntry(vFadds, 5*i+1), Vec_IntEntry(vFadds, 5*i+2)  );
                }
            }
        } while ( fFound );
        // check if we can extract HADDs
        do {
            fFound = 0; 
            for ( i = Vec_IntSize(vHadds)/2 - 1; i >= 0; i-- )
            {
                iXor = Vec_IntEntry(vHadds, 2*i+0);
                iMaj = Vec_IntEntry(vHadds, 2*i+1);
                if ( Vec_IntEntry(vMap, iXor) && Vec_IntEntry(vMap, iMaj) )
                {
                    Gia_Obj_t * pAnd = Gia_ManObj( pGia, iMaj );
                    Vec_IntWriteEntry( vMap, iXor, 0 );
                    Vec_IntWriteEntry( vMap, iMaj, 0 );
                    Vec_IntWriteEntry( vMap, Gia_ObjFaninId0(pAnd, iMaj), 1 );
                    Vec_IntWriteEntry( vMap, Gia_ObjFaninId1(pAnd, iMaj), 1 );
                    Vec_IntPush( vRecord, Abc_Var2Lit2(i, 1) );
                    fFound = 1;
                    fFoundAll = 1;
                    if ( fVeryVerbose )
                        printf( "Recognizing (%d %d) => HA(%d %d)\n", iXor, iMaj, Gia_ObjFaninId0(pAnd, iMaj), Gia_ObjFaninId1(pAnd, iMaj) );
                }
            }
            break; // only one iter!
        } while ( fFound );
        if ( fFoundAll )
            continue;
/*
        // find the last one
        Vec_IntForEachEntryReverse( vMap, Entry, iAnd )
            if ( Entry && Gia_ObjIsAnd(Gia_ManObj(pGia, iAnd)) )//&& Vec_IntFind(vFadds, iAnd) == -1 )//&& Vec_IntFind(vHadds, iAnd) == -1 )
            {
                Gia_Obj_t * pFan0, * pFan1, * pAnd = Gia_ManObj( pGia, iAnd );
                if ( !Gia_ObjRecognizeExor(pAnd, &pFan0, &pFan1) )
                {
                    Vec_IntWriteEntry( vMap, iAnd, 0 );
                    Vec_IntWriteEntry( vMap, Gia_ObjFaninId0(pAnd, iAnd), 1 );
                    Vec_IntWriteEntry( vMap, Gia_ObjFaninId1(pAnd, iAnd), 1 );
                    Vec_IntPush( vRecord, Abc_Var2Lit2(iAnd, 0) );
                }
                else
                {
                    Vec_IntWriteEntry( vMap, iAnd, 0 );
                    Vec_IntWriteEntry( vMap, Gia_ObjId(pGia, pFan0), 1 );
                    Vec_IntWriteEntry( vMap, Gia_ObjId(pGia, pFan1), 1 );
                    Vec_IntPush( vRecord, Abc_Var2Lit2(iAnd, 0) );
                    Vec_IntPush( vRecord, Abc_Var2Lit2(Gia_ObjFaninId0(pAnd, iAnd), 0) );
                    Vec_IntPush( vRecord, Abc_Var2Lit2(Gia_ObjFaninId1(pAnd, iAnd), 0) );
                    printf( "Recognizing %d => XOR(%d %d)\n", iAnd, Gia_ObjId(pGia, pFan0), Gia_ObjId(pGia, pFan1) );
                }
                fFoundAll = 1;
                if ( fVeryVerbose )
                    printf( "Recognizing %d => AND(%d %d)\n", iAnd, Gia_ObjFaninId0(pAnd, iAnd), Gia_ObjFaninId1(pAnd, iAnd) );
                break;
            }
*/
    }
    //Vec_IntPrint( vMap );

    // collect remaining ones
    vLeft = Vec_IntAlloc( 100 );
    Vec_IntForEachEntry( vMap, Entry, i )
        if ( Entry && Gia_ObjIsAnd(Gia_ManObj(pGia, i)) )
            Vec_IntPush( vLeft, i );
    Vec_IntFree( vMap );

    // collect them in the topo order
    vRecord2 = Vec_IntAlloc( 100 );
    Gia_ManIncrementTravId( pGia );
    Gia_ManCollectAnds( pGia, Vec_IntArray(vLeft), Vec_IntSize(vLeft), vRecord2, NULL );
    Vec_IntForEachEntry( vRecord2, iAnd, i )
        Vec_IntWriteEntry( vRecord2, i, Abc_Var2Lit2(iAnd, 0) );

    // dump remaining nodes as an AIG
    if ( fDumpLeftOver )
    {        
        Gia_Man_t * pNew;
        pNew = Gia_ManDupAndCones( pGia, Vec_IntArray(vLeft), Vec_IntSize(vLeft), 0 );
        Gia_AigerWrite( pNew, "leftover.aig", 0, 0, 0 );
        printf( "Leftover AIG with %d nodes is dumped into file \"%s\".\n", Gia_ManAndNum(pNew), "leftover.aig" );
        Gia_ManStop( pNew );
    }
    Vec_IntFree( vLeft );

    Vec_IntReverseOrder( vRecord );
    Vec_IntAppend( vRecord2, vRecord );
    Vec_IntFree( vRecord );
    return vRecord2;
}